

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O1

void __thiscall cmFindCommon::SelectDefaultSearchModes(cmFindCommon *this)

{
  bool bVar1;
  char *val;
  long lVar2;
  long *plVar3;
  string *name;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_5UL>
  search_paths;
  string local_e8;
  bool *local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  bool *local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  bool *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  bool *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  name = &local_e8;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)name,"CMAKE_FIND_USE_PACAKGE_ROOT_PATH","");
  local_c8 = &this->NoCMakePath;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"CMAKE_FIND_USE_CMAKE_PATH","")
  ;
  local_a0 = &this->NoCMakeEnvironmentPath;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH","");
  local_78 = &this->NoSystemEnvironmentPath;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH","");
  local_50 = &this->NoCMakeSystemPath;
  plVar3 = local_38;
  local_48[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"CMAKE_FIND_USE_CMAKE_SYSTEM_PATH","");
  lVar2 = 200;
  do {
    val = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    if (val != (char *)0x0) {
      bVar1 = cmSystemTools::IsOn(val);
      *(bool *)*(undefined8 *)((long)&name[-1].field_2 + 8) = !bVar1;
    }
    name = (string *)&name[1]._M_string_length;
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != 0);
  lVar2 = -200;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultSearchModes()
{
  const std::array<std::pair<bool&, std::string>, 5> search_paths = {
    { { this->NoPackageRootPath, "CMAKE_FIND_USE_PACAKGE_ROOT_PATH" },
      { this->NoCMakePath, "CMAKE_FIND_USE_CMAKE_PATH" },
      { this->NoCMakeEnvironmentPath,
        "CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH" },
      { this->NoSystemEnvironmentPath,
        "CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH" },
      { this->NoCMakeSystemPath, "CMAKE_FIND_USE_CMAKE_SYSTEM_PATH" } }
  };

  for (auto& path : search_paths) {
    const char* def = this->Makefile->GetDefinition(path.second);
    if (def) {
      path.first = !cmSystemTools::IsOn(def);
    }
  }
}